

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimemagicrule.cpp
# Opt level: O2

QByteArray * __thiscall
QMimeMagicRule::mask(QByteArray *__return_storage_ptr__,QMimeMagicRule *this)

{
  qsizetype qVar1;
  Data *pDVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_78;
  QStringBuilder<const_char_(&)[3],_QByteArray> local_58;
  QArrayDataPointer<char> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = &DAT_aaaaaaaaaaaaaaaa;
  QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,&(this->m_mask).d);
  if (this->m_type == String) {
    QByteArray::toHex((QByteArray *)&local_78,__return_storage_ptr__,'\0');
    local_58.b.d.size = local_78.size;
    local_58.b.d.ptr = local_78.ptr;
    local_58.b.d.d = local_78.d;
    local_58.a = (char (*) [3])0x472dcb;
    local_78.d = (Data *)0x0;
    local_78.ptr = (char *)0x0;
    local_78.size = 0;
    QStringBuilder<const_char_(&)[3],_QByteArray>::convertTo<QByteArray>
              ((QByteArray *)&local_38,&local_58);
    pDVar2 = (__return_storage_ptr__->d).d;
    pcVar3 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_38.d;
    (__return_storage_ptr__->d).ptr = local_38.ptr;
    qVar1 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_38.size;
    local_38.d = pDVar2;
    local_38.ptr = pcVar3;
    local_38.size = qVar1;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58.b.d);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray QMimeMagicRule::mask() const
{
    QByteArray result = m_mask;
    if (m_type == String) {
        // restore '0x'
        result = "0x" + result.toHex();
    }
    return result;
}